

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

curl_off_t Curl_mime_size(curl_mimepart *part)

{
  curl_off_t cVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  curl_mimepart *part_00;
  curl_slist *pcVar7;
  
  if (part->kind == MIMEKIND_MULTIPART) {
    if (part->arg == (void *)0x0) {
      lVar4 = 0;
    }
    else {
      part_00 = *(curl_mimepart **)((long)part->arg + 0x10);
      lVar4 = 0x2e;
      if (part_00 != (curl_mimepart *)0x0) {
        do {
          cVar1 = Curl_mime_size(part_00);
          if (cVar1 < 0) {
            lVar4 = cVar1;
          }
          lVar5 = cVar1 + 0x2e;
          if (lVar4 < 0) {
            lVar5 = 0;
          }
          lVar4 = lVar4 + lVar5;
          part_00 = part_00->nextpart;
        } while (part_00 != (curl_mimepart *)0x0);
      }
    }
    part->datasize = lVar4;
  }
  else {
    lVar4 = part->datasize;
  }
  if (part->encoder != (mime_encoder *)0x0) {
    lVar4 = (*part->encoder->sizefunc)(part);
  }
  if ((-1 < lVar4) && ((part->flags & 2) == 0)) {
    lVar5 = 0;
    for (pcVar7 = part->curlheaders; pcVar7 != (curl_slist *)0x0; pcVar7 = pcVar7->next) {
      sVar2 = strlen(pcVar7->data);
      lVar5 = lVar5 + sVar2 + 2;
    }
    lVar6 = 0;
    for (pcVar7 = part->userheaders; pcVar7 != (curl_slist *)0x0; pcVar7 = pcVar7->next) {
      pcVar3 = match_header(pcVar7,"Content-Type",0xc);
      if (pcVar3 == (char *)0x0) {
        sVar2 = strlen(pcVar7->data);
        lVar6 = lVar6 + sVar2 + 2;
      }
    }
    lVar4 = lVar4 + lVar5 + lVar6 + 2;
  }
  return lVar4;
}

Assistant:

curl_off_t Curl_mime_size(curl_mimepart *part)
{
  curl_off_t size;

  if(part->kind == MIMEKIND_MULTIPART)
    part->datasize = multipart_size(part->arg);

  size = part->datasize;

  if(part->encoder)
    size = part->encoder->sizefunc(part);

  if(size >= 0 && !(part->flags & MIME_BODY_ONLY)) {
    /* Compute total part size. */
    size += slist_size(part->curlheaders, 2, NULL, 0);
    size += slist_size(part->userheaders, 2, STRCONST("Content-Type"));
    size += 2;    /* CRLF after headers. */
  }
  return size;
}